

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.cpp
# Opt level: O0

void __thiscall Ray::Ray(Ray *this,vec3 *o,vec3 *d,float near,float far)

{
  value_type *pvVar1;
  tvec3<float> local_34;
  float local_28;
  float local_24;
  float far_local;
  float near_local;
  vec3 *d_local;
  vec3 *o_local;
  Ray *this_local;
  
  local_28 = far;
  local_24 = near;
  _far_local = d;
  d_local = o;
  o_local = &this->origin;
  glm::detail::tvec3<float>::tvec3(&this->origin);
  glm::detail::tvec3<float>::tvec3(&this->dir);
  glm::detail::tvec3<float>::tvec3(&this->invdir);
  glm::detail::tvec3<float>::operator=(&this->origin,o);
  glm::normalize<float>((glm *)&local_34,d);
  glm::detail::tvec3<float>::operator=(&this->dir,&local_34);
  this->tMin = local_24;
  this->tMax = local_28;
  (this->invdir).field_0.field_0.x = 1.0 / (this->dir).field_0.field_0.x;
  (this->invdir).field_0.field_0.y = 1.0 / (this->dir).field_0.field_0.y;
  (this->invdir).field_0.field_0.z = 1.0 / (this->dir).field_0.field_0.z;
  this->sign[0] = (this->invdir).field_0.field_0.x <= 0.0 && (this->invdir).field_0.field_0.x != 0.0
  ;
  pvVar1 = &(this->invdir).field_0.field_0.y;
  this->sign[1] = *pvVar1 <= 0.0 && *pvVar1 != 0.0;
  pvVar1 = &(this->invdir).field_0.field_0.z;
  this->sign[2] = *pvVar1 <= 0.0 && *pvVar1 != 0.0;
  return;
}

Assistant:

Ray::Ray(glm::vec3 o, glm::vec3 d, float near, float far) {
    origin = o; dir = glm::normalize(d); tMin = near; tMax = far;
    invdir.x = 1 / dir.x;
    invdir.y = 1 / dir.y;
    invdir.z = 1 / dir.z;
    sign[0] = (invdir.x < 0);
    sign[1] = (invdir.y < 0);
    sign[2] = (invdir.z < 0);
}